

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O3

TestCaseGroup * vkt::memory::createPipelineBarrierTests(TestContext *testCtx)

{
  pointer pcVar1;
  bool bVar2;
  size_t sVar3;
  TestNode *pTVar4;
  TestNode *pTVar5;
  char *pcVar6;
  undefined8 uVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  string usageGroupName;
  string testName;
  ostringstream s;
  TestNode *local_208;
  TestContext *local_200;
  long *local_1f8 [2];
  long local_1e8 [2];
  long *local_1d8;
  long local_1c8 [2];
  uint local_1b8;
  uint local_1b4;
  long local_1b0;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_208 = (TestNode *)operator_new(0x70);
  pcVar6 = "Pipeline barrier tests.";
  local_200 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_208,testCtx,"pipeline_barrier","Pipeline barrier tests.");
  uVar7 = CONCAT71((int7)((ulong)pcVar6 >> 8),1);
  lVar10 = 0;
  do {
    local_1b8 = (uint)uVar7;
    local_1b4 = (&DAT_00b2e9c0)[lVar10];
    lVar10 = 0;
    do {
      uVar8 = (&DAT_00b2ab90)[lVar10] | local_1b4;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      bVar2 = true;
      lVar9 = 0;
      local_1b0 = lVar10;
      do {
        if ((*(uint *)((long)&DAT_00d2e150 + lVar9) & uVar8) != 0) {
          if (!bVar2) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_",1);
          }
          pcVar6 = *(char **)((long)&PTR_anon_var_dwarf_e05c9f_00d2e158 + lVar9);
          if (pcVar6 == (char *)0x0) {
            std::ios::clear((int)&local_208 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x60);
          }
          else {
            sVar3 = strlen(pcVar6);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar3);
          }
          bVar2 = false;
        }
        lVar9 = lVar9 + 0x10;
      } while (lVar9 != 0x100);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      pTVar4 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar4,local_200,(char *)local_1f8[0],(char *)local_1f8[0]);
      lVar10 = 0;
      do {
        pcVar1 = *(pointer *)((long)&DAT_00b2e9a0 + lVar10);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        pTVar5 = (TestNode *)operator_new(0x90);
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar5,local_200,NODETYPE_SELF_VALIDATE,(char *)local_1d8,
                   (char *)local_1d8);
        pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d2e260;
        *(uint *)&pTVar5[1].m_testCtx = uVar8;
        pTVar5[1].m_name._M_dataplus._M_p = pcVar1;
        *(undefined4 *)&pTVar5[1].m_name._M_string_length = 0;
        tcu::TestNode::addChild(pTVar4,pTVar5);
        if (local_1d8 != local_1c8) {
          operator_delete(local_1d8,local_1c8[0] + 1);
        }
        lVar10 = lVar10 + 8;
      } while (lVar10 != 0x20);
      tcu::TestNode::addChild(local_208,pTVar4);
      if (local_1f8[0] != local_1e8) {
        operator_delete(local_1f8[0],local_1e8[0] + 1);
      }
      lVar10 = local_1b0 + 1;
    } while (lVar10 != 10);
    lVar10 = 1;
    uVar7 = 0;
  } while ((local_1b8 & 1) != 0);
  local_1f8[0] = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"all","");
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,local_200,(char *)local_1f8[0],(char *)local_1f8[0]);
  lVar10 = 0;
  do {
    pcVar1 = *(pointer *)((long)&DAT_00b2e9a0 + lVar10);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    pTVar5 = (TestNode *)operator_new(0x90);
    tcu::TestCase::TestCase
              ((TestCase *)pTVar5,local_200,NODETYPE_SELF_VALIDATE,(char *)local_1d8,
               (char *)local_1d8);
    pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d2e260;
    *(undefined4 *)&pTVar5[1].m_testCtx = 0x1bff;
    pTVar5[1].m_name._M_dataplus._M_p = pcVar1;
    *(undefined4 *)&pTVar5[1].m_name._M_string_length = 0;
    tcu::TestNode::addChild(pTVar4,pTVar5);
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8,local_1c8[0] + 1);
    }
    lVar10 = lVar10 + 8;
  } while (lVar10 != 0x20);
  tcu::TestNode::addChild(local_208,pTVar4);
  if (local_1f8[0] != local_1e8) {
    operator_delete(local_1f8[0],local_1e8[0] + 1);
  }
  local_1f8[0] = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"all_device","");
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,local_200,(char *)local_1f8[0],(char *)local_1f8[0]);
  lVar10 = 0;
  do {
    pcVar1 = *(pointer *)((long)&DAT_00b2e9a0 + lVar10);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    pTVar5 = (TestNode *)operator_new(0x90);
    tcu::TestCase::TestCase
              ((TestCase *)pTVar5,local_200,NODETYPE_SELF_VALIDATE,(char *)local_1d8,
               (char *)local_1d8);
    pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d2e260;
    *(undefined4 *)&pTVar5[1].m_testCtx = 0x1bfc;
    pTVar5[1].m_name._M_dataplus._M_p = pcVar1;
    *(undefined4 *)&pTVar5[1].m_name._M_string_length = 0;
    tcu::TestNode::addChild(pTVar4,pTVar5);
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8,local_1c8[0] + 1);
    }
    lVar10 = lVar10 + 8;
  } while (lVar10 != 0x20);
  tcu::TestNode::addChild(local_208,pTVar4);
  if (local_1f8[0] != local_1e8) {
    operator_delete(local_1f8[0],local_1e8[0] + 1);
  }
  return (TestCaseGroup *)local_208;
}

Assistant:

tcu::TestCaseGroup* createPipelineBarrierTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup>	group			(new tcu::TestCaseGroup(testCtx, "pipeline_barrier", "Pipeline barrier tests."));
	const vk::VkDeviceSize			sizes[]			=
	{
		1024,		// 1K
		8*1024,		// 8K
		64*1024,	// 64K
		1024*1024,	// 1M
	};
	const Usage						usages[]		=
	{
		USAGE_HOST_READ,
		USAGE_HOST_WRITE,
		USAGE_TRANSFER_SRC,
		USAGE_TRANSFER_DST,
		USAGE_VERTEX_BUFFER,
		USAGE_INDEX_BUFFER,
		USAGE_UNIFORM_BUFFER,
		USAGE_UNIFORM_TEXEL_BUFFER,
		USAGE_STORAGE_BUFFER,
		USAGE_STORAGE_TEXEL_BUFFER,
		USAGE_STORAGE_IMAGE,
		USAGE_SAMPLED_IMAGE
	};
	const Usage						readUsages[]		=
	{
		USAGE_HOST_READ,
		USAGE_TRANSFER_SRC,
		USAGE_VERTEX_BUFFER,
		USAGE_INDEX_BUFFER,
		USAGE_UNIFORM_BUFFER,
		USAGE_UNIFORM_TEXEL_BUFFER,
		USAGE_STORAGE_BUFFER,
		USAGE_STORAGE_TEXEL_BUFFER,
		USAGE_STORAGE_IMAGE,
		USAGE_SAMPLED_IMAGE
	};

	const Usage						writeUsages[]	=
	{
		USAGE_HOST_WRITE,
		USAGE_TRANSFER_DST
	};

	for (size_t writeUsageNdx = 0; writeUsageNdx < DE_LENGTH_OF_ARRAY(writeUsages); writeUsageNdx++)
	{
		const Usage	writeUsage	= writeUsages[writeUsageNdx];

		for (size_t readUsageNdx = 0; readUsageNdx < DE_LENGTH_OF_ARRAY(readUsages); readUsageNdx++)
		{
			const Usage						readUsage		= readUsages[readUsageNdx];
			const Usage						usage			= writeUsage | readUsage;
			const string					usageGroupName	(usageToName(usage));
			de::MovePtr<tcu::TestCaseGroup>	usageGroup		(new tcu::TestCaseGroup(testCtx, usageGroupName.c_str(), usageGroupName.c_str()));

			for (size_t sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(sizes); sizeNdx++)
			{
				const vk::VkDeviceSize	size		= sizes[sizeNdx];
				const string			testName	(de::toString((deUint64)(size)));
				const TestConfig		config		=
				{
					usage,
					size,
					vk::VK_SHARING_MODE_EXCLUSIVE
				};

				usageGroup->addChild(new InstanceFactory1<MemoryTestInstance, TestConfig, AddPrograms>(testCtx,tcu::NODETYPE_SELF_VALIDATE,  testName, testName, AddPrograms(), config));
			}

			group->addChild(usageGroup.get());
			usageGroup.release();
		}
	}

	{
		Usage all = (Usage)0;

		for (size_t usageNdx = 0; usageNdx < DE_LENGTH_OF_ARRAY(usages); usageNdx++)
			all = all | usages[usageNdx];

		{
			const string					usageGroupName	("all");
			de::MovePtr<tcu::TestCaseGroup>	usageGroup		(new tcu::TestCaseGroup(testCtx, usageGroupName.c_str(), usageGroupName.c_str()));

			for (size_t sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(sizes); sizeNdx++)
			{
				const vk::VkDeviceSize	size		= sizes[sizeNdx];
				const string			testName	(de::toString((deUint64)(size)));
				const TestConfig		config		=
				{
					all,
					size,
					vk::VK_SHARING_MODE_EXCLUSIVE
				};

				usageGroup->addChild(new InstanceFactory1<MemoryTestInstance, TestConfig, AddPrograms>(testCtx,tcu::NODETYPE_SELF_VALIDATE,  testName, testName, AddPrograms(), config));
			}

			group->addChild(usageGroup.get());
			usageGroup.release();
		}

		{
			const string					usageGroupName	("all_device");
			de::MovePtr<tcu::TestCaseGroup>	usageGroup		(new tcu::TestCaseGroup(testCtx, usageGroupName.c_str(), usageGroupName.c_str()));

			for (size_t sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(sizes); sizeNdx++)
			{
				const vk::VkDeviceSize	size		= sizes[sizeNdx];
				const string			testName	(de::toString((deUint64)(size)));
				const TestConfig		config		=
				{
					(Usage)(all & (~(USAGE_HOST_READ|USAGE_HOST_WRITE))),
					size,
					vk::VK_SHARING_MODE_EXCLUSIVE
				};

				usageGroup->addChild(new InstanceFactory1<MemoryTestInstance, TestConfig, AddPrograms>(testCtx,tcu::NODETYPE_SELF_VALIDATE,  testName, testName, AddPrograms(), config));
			}

			group->addChild(usageGroup.get());
			usageGroup.release();
		}
	}

	return group.release();
}